

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-verify.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  string ascFilename;
  string plain;
  string key;
  string asc;
  vector<char,_std::allocator<char>_> cstr;
  ifstream ascFile;
  ifstream textFile;
  ifstream keyFile;
  long *local_8b0 [2];
  long local_8a0 [2];
  undefined1 *local_890;
  long local_888;
  undefined1 local_880;
  undefined7 uStack_87f;
  undefined1 *local_870;
  long local_868;
  undefined1 local_860;
  undefined7 uStack_85f;
  char *local_850;
  long local_848;
  char local_840;
  undefined7 uStack_83f;
  long *local_830 [2];
  long local_820 [2];
  long *local_810 [2];
  long local_800 [2];
  long *local_7f0 [2];
  long local_7e0 [2];
  void *local_7d0 [2];
  long local_7c0 [14];
  ios_base local_750 [264];
  char local_648 [16];
  streambuf local_638 [504];
  char local_440 [16];
  streambuf local_430 [504];
  char local_238 [16];
  streambuf local_228 [504];
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"VerifyRSA - https://github.com/rodlie/verifyrsa",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    uVar2 = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: rsa-verify <public key> <text file>",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  else {
    local_868 = 0;
    local_860 = 0;
    local_888 = 0;
    local_880 = 0;
    local_848 = 0;
    local_840 = '\0';
    local_890 = &local_880;
    local_870 = &local_860;
    local_850 = &local_840;
    std::ifstream::ifstream(local_238);
    std::ifstream::ifstream(local_440);
    std::ifstream::ifstream(local_648);
    std::ifstream::open(local_238,(_Ios_Openmode)argv[1]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_7d0);
      std::ostream::operator<<((ostream *)local_7c0,local_228);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_870,(string *)local_8b0);
      if (local_8b0[0] != local_8a0) {
        operator_delete(local_8b0[0],local_8a0[0] + 1);
      }
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_7d0);
      std::ios_base::~ios_base(local_750);
    }
    std::ifstream::open(local_440,(_Ios_Openmode)argv[2]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_7d0);
      std::ostream::operator<<((ostream *)local_7c0,local_430);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_890,(string *)local_8b0);
      if (local_8b0[0] != local_8a0) {
        operator_delete(local_8b0[0],local_8a0[0] + 1);
      }
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_7d0);
      std::ios_base::~ios_base(local_750);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8b0,argv[2],(allocator<char> *)local_7d0);
    std::__cxx11::string::append((char *)local_8b0);
    std::ifstream::open(local_648,(_Ios_Openmode)local_8b0[0]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_7d0);
      std::ostream::operator<<((ostream *)local_7c0,local_638);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_850,(string *)local_7f0);
      if (local_7f0[0] != local_7e0) {
        operator_delete(local_7f0[0],local_7e0[0] + 1);
      }
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_7d0);
      std::ios_base::~ios_base(local_750);
    }
    if (((local_868 == 0) || (local_888 == 0)) || (local_848 == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Missing key, text or asc.",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      uVar2 = 1;
      std::ostream::flush();
    }
    else {
      std::vector<char,std::allocator<char>>::vector<char_const*,void>
                ((vector<char,std::allocator<char>> *)local_7d0,local_850,local_850 + local_848 + 1,
                 (allocator_type *)local_7f0);
      local_810[0] = local_800;
      std::__cxx11::string::_M_construct<char*>((string *)local_810,local_870,local_870 + local_868)
      ;
      local_830[0] = local_820;
      std::__cxx11::string::_M_construct<char*>((string *)local_830,local_890,local_890 + local_888)
      ;
      cVar1 = VerifyRSA::verify(local_810,local_830,local_7d0[0]);
      if (local_830[0] != local_820) {
        operator_delete(local_830[0],local_820[0] + 1);
      }
      if (local_810[0] != local_800) {
        operator_delete(local_810[0],local_800[0] + 1);
      }
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Bad signature!",0xe);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Valid signature!",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
      }
      uVar2 = (uint)(cVar1 == '\0');
      if (local_7d0[0] != (void *)0x0) {
        operator_delete(local_7d0[0],local_7c0[0] - (long)local_7d0[0]);
      }
    }
    if (local_8b0[0] != local_8a0) {
      operator_delete(local_8b0[0],local_8a0[0] + 1);
    }
    std::ifstream::~ifstream(local_648);
    std::ifstream::~ifstream(local_440);
    std::ifstream::~ifstream(local_238);
    if (local_850 != &local_840) {
      operator_delete(local_850,CONCAT71(uStack_83f,local_840) + 1);
    }
    if (local_890 != &local_880) {
      operator_delete(local_890,CONCAT71(uStack_87f,local_880) + 1);
    }
    if (local_870 != &local_860) {
      operator_delete(local_870,CONCAT71(uStack_85f,local_860) + 1);
    }
  }
  return uVar2;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<3) {
        std::cout << "VerifyRSA - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-verify <public key> <text file>" << std::endl;
        return 0;
    }

    std::string key, plain, asc;
    std::ifstream keyFile, textFile, ascFile;
    keyFile.open(argv[1]);
    if (keyFile.is_open()) {
        std::stringstream ss;
        ss << keyFile.rdbuf();
        key = ss.str();
        keyFile.close();
    }
    textFile.open(argv[2]);
    if (textFile.is_open()) {
        std::stringstream ss;
        ss << textFile.rdbuf();
        plain = ss.str();
        textFile.close();
    }
    std::string ascFilename = argv[2];
    ascFilename.append(".asc");
    ascFile.open(ascFilename.c_str());
    if (ascFile.is_open()) {
        std::stringstream ss;
        ss << ascFile.rdbuf();
        asc = ss.str();
        ascFile.close();
    }

    if (key.empty() || plain.empty() || asc.empty()) {
        std::cerr << "Missing key, text or asc." << std::endl;
        return 1;
    }
    
    std::vector<char> cstr(asc.c_str(), asc.c_str() + asc.size() + 1);
    if (!VerifyRSA::verify(key, plain, cstr.data())) {
        std::cerr << "Bad signature!" << std::endl;
        return 1;
    }
    std::cout << "Valid signature!" << std::endl;
    return 0;
}